

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

void __thiscall
pybind11::detail::loader_life_support::loader_life_support(loader_life_support *this)

{
  Py_tss_t *pPVar1;
  loader_life_support *plVar2;
  
  this->parent = (loader_life_support *)0x0;
  (this->keep_alive)._M_h._M_buckets = &(this->keep_alive)._M_h._M_single_bucket;
  (this->keep_alive)._M_h._M_bucket_count = 1;
  (this->keep_alive)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->keep_alive)._M_h._M_element_count = 0;
  (this->keep_alive)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->keep_alive)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->keep_alive)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pPVar1 = get_stack_tls_key();
  plVar2 = (loader_life_support *)PyThread_tss_get(pPVar1);
  this->parent = plVar2;
  pPVar1 = get_stack_tls_key();
  PyThread_tss_set(pPVar1,this);
  return;
}

Assistant:

loader_life_support() {
        parent = get_stack_top();
        set_stack_top(this);
    }